

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

xmlIDPtr xmlAddID(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlChar *value,xmlAttrPtr attr)

{
  int iVar1;
  xmlHashTablePtr table;
  xmlIDPtr id;
  xmlChar *pxVar2;
  xmlAttrPtr pxVar3;
  long lVar4;
  long lVar5;
  char *extra;
  
  if (value == (xmlChar *)0x0 || doc == (xmlDocPtr)0x0) {
    return (xmlIDPtr)0x0;
  }
  if (attr == (xmlAttrPtr)0x0) {
    return (xmlIDPtr)0x0;
  }
  if (*value == '\0') {
    return (xmlIDPtr)0x0;
  }
  table = (xmlHashTablePtr)doc->ids;
  if (table == (xmlHashTablePtr)0x0) {
    table = xmlHashCreateDict(0,doc->dict);
    doc->ids = table;
    if (table == (xmlHashTablePtr)0x0) {
      extra = "xmlAddID: Table creation failed!\n";
      goto LAB_0018af4b;
    }
  }
  id = (xmlIDPtr)(*xmlMalloc)(0x30);
  if (id != (xmlIDPtr)0x0) {
    pxVar2 = xmlStrdup(value);
    id->value = pxVar2;
    id->doc = doc;
    iVar1 = xmlIsStreaming(ctxt);
    if (iVar1 == 0) {
      lVar4 = 0x18;
      lVar5 = 0x10;
      pxVar3 = attr;
    }
    else {
      if (doc->dict == (xmlDictPtr)0x0) {
        pxVar3 = (xmlAttrPtr)xmlStrdup(attr->name);
      }
      else {
        pxVar3 = (xmlAttrPtr)xmlDictLookup(doc->dict,attr->name,-1);
      }
      lVar4 = 0x10;
      lVar5 = 0x18;
    }
    *(xmlAttrPtr *)((long)&id->next + lVar5) = pxVar3;
    *(undefined8 *)((long)&id->next + lVar4) = 0;
    lVar4 = xmlGetLineNo(attr->parent);
    id->lineno = (int)lVar4;
    iVar1 = xmlHashAddEntry(table,value,id);
    if (iVar1 < 0) {
      if (ctxt != (xmlValidCtxtPtr)0x0) {
        xmlErrValidNode(ctxt,attr->parent,XML_DTD_ID_REDEFINED,"ID %s already defined\n",value,
                        (xmlChar *)0x0,(xmlChar *)0x0);
      }
      xmlFreeID(id);
      return (xmlIDPtr)0x0;
    }
    attr->atype = XML_ATTRIBUTE_ID;
    return id;
  }
  extra = "malloc failed";
LAB_0018af4b:
  xmlVErrMemory(ctxt,extra);
  return (xmlIDPtr)0x0;
}

Assistant:

xmlIDPtr
xmlAddID(xmlValidCtxtPtr ctxt, xmlDocPtr doc, const xmlChar *value,
         xmlAttrPtr attr) {
    xmlIDPtr ret;
    xmlIDTablePtr table;

    if (doc == NULL) {
	return(NULL);
    }
    if ((value == NULL) || (value[0] == 0)) {
	return(NULL);
    }
    if (attr == NULL) {
	return(NULL);
    }

    /*
     * Create the ID table if needed.
     */
    table = (xmlIDTablePtr) doc->ids;
    if (table == NULL)  {
        doc->ids = table = xmlHashCreateDict(0, doc->dict);
    }
    if (table == NULL) {
	xmlVErrMemory(ctxt,
		"xmlAddID: Table creation failed!\n");
        return(NULL);
    }

    ret = (xmlIDPtr) xmlMalloc(sizeof(xmlID));
    if (ret == NULL) {
	xmlVErrMemory(ctxt, "malloc failed");
	return(NULL);
    }

    /*
     * fill the structure.
     */
    ret->value = xmlStrdup(value);
    ret->doc = doc;
    if (xmlIsStreaming(ctxt)) {
	/*
	 * Operating in streaming mode, attr is gonna disappear
	 */
	if (doc->dict != NULL)
	    ret->name = xmlDictLookup(doc->dict, attr->name, -1);
	else
	    ret->name = xmlStrdup(attr->name);
	ret->attr = NULL;
    } else {
	ret->attr = attr;
	ret->name = NULL;
    }
    ret->lineno = xmlGetLineNo(attr->parent);

    if (xmlHashAddEntry(table, value, ret) < 0) {
#ifdef LIBXML_VALID_ENABLED
	/*
	 * The id is already defined in this DTD.
	 */
	if (ctxt != NULL) {
	    xmlErrValidNode(ctxt, attr->parent, XML_DTD_ID_REDEFINED,
			    "ID %s already defined\n", value, NULL, NULL);
	}
#endif /* LIBXML_VALID_ENABLED */
	xmlFreeID(ret);
	return(NULL);
    }
    if (attr != NULL)
	attr->atype = XML_ATTRIBUTE_ID;
    return(ret);
}